

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O3

int ddGroupSiftingUp(DdManager *table,int y,int xLow,DD_CHKFP checkFunction,Move **moves)

{
  int y_00;
  DdHalfWord x;
  DdSubtable *pDVar1;
  Move *pMVar2;
  Move *pMVar3;
  DdHalfWord DVar4;
  int iVar5;
  DdHalfWord x_00;
  int iVar6;
  DdHalfWord DVar7;
  int iVar8;
  uint uVar9;
  DdNode *pDVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  int local_58;
  
  y_00 = table->invperm[y];
  uVar9 = y;
  do {
    uVar12 = uVar9;
    uVar9 = table->subtables[(int)uVar12].next;
  } while (uVar12 < uVar9);
  iVar13 = table->keys - table->isolated;
  local_58 = iVar13;
  if (xLow < (int)uVar12) {
    lVar14 = (long)xLow;
    lVar11 = lVar14 * 0xe + 0x12;
    do {
      iVar6 = table->invperm[lVar14 + 1];
      if ((iVar6 == y_00) || (iVar5 = cuddTestInteract(table,iVar6,y_00), iVar5 != 0)) {
        local_58 = (local_58 + (uint)(table->vars[iVar6]->ref == 1)) -
                   *(int *)((long)&table->subtables->nodelist + lVar11 * 4);
      }
      lVar14 = lVar14 + 1;
      lVar11 = lVar11 + 0xe;
    } while ((int)uVar12 != lVar14);
  }
  x_00 = cuddNextLow(table,y);
  if (((int)x_00 < xLow) || (iVar13 < local_58)) {
    return 1;
  }
  do {
    x = table->subtables[(int)x_00].next;
    iVar6 = (*checkFunction)(table,x_00,y);
    pDVar1 = table->subtables;
    if (iVar6 == 0) {
      if ((pDVar1[(int)x_00].next == x_00) && (pDVar1[y].next == y)) {
        iVar6 = table->invperm[(int)x_00];
        iVar5 = cuddSwapInPlace(table,x_00,y);
        if (iVar5 == 0) {
LAB_0091f9a3:
          pMVar3 = *moves;
          while (pMVar3 != (Move *)0x0) {
            pMVar2 = pMVar3->next;
            pMVar3->y = 0;
            *(DdNode **)&pMVar3->flags = table->nextFree;
            table->nextFree = (DdNode *)*moves;
            *moves = pMVar2;
            pMVar3 = pMVar2;
          }
          return 0;
        }
        iVar8 = cuddTestInteract(table,iVar6,y_00);
        if (iVar8 != 0) {
          local_58 = (local_58 - (uint)(table->vars[iVar6]->ref == 1)) + table->subtables[y].keys;
        }
        pDVar10 = cuddDynamicAllocNode(table);
        if (pDVar10 == (DdNode *)0x0) goto LAB_0091f9a3;
        pDVar10->index = x_00;
        pDVar10->ref = y;
        *(undefined4 *)&pDVar10->next = 0;
        *(int *)((long)&pDVar10->next + 4) = iVar5;
        (pDVar10->type).kids.T = (DdNode *)*moves;
        *moves = (Move *)pDVar10;
        if ((double)iVar13 * table->maxGrowth < (double)iVar5) {
          return 1;
        }
        if (iVar5 < iVar13) {
          iVar13 = iVar5;
        }
      }
      else {
        iVar6 = ddGroupMove(table,x_00,y,moves);
        if (iVar6 == 0) goto LAB_0091f9a3;
        uVar9 = (*moves)->y;
        do {
          iVar5 = table->invperm[(int)uVar9];
          iVar8 = cuddTestInteract(table,iVar5,y_00);
          if (iVar8 != 0) {
            local_58 = (local_58 - (uint)(table->vars[iVar5]->ref == 1)) +
                       table->subtables[(int)uVar9].keys;
          }
          uVar9 = table->subtables[(int)uVar9].next;
        } while (uVar9 != (*moves)->y);
        if ((double)iVar13 * table->maxGrowth < (double)iVar6) {
          return 1;
        }
        if (iVar6 < iVar13) {
          iVar13 = iVar6;
        }
      }
    }
    else {
      pDVar1[(int)x_00].next = y;
      DVar4 = pDVar1[y].next;
      do {
        DVar7 = DVar4;
        DVar4 = pDVar1[(int)DVar7].next;
      } while (pDVar1[(int)DVar7].next != y);
      pDVar1[(int)DVar7].next = x;
      pDVar10 = cuddDynamicAllocNode(table);
      if (pDVar10 == (DdNode *)0x0) goto LAB_0091f9a3;
      pDVar10->index = x_00;
      pDVar10->ref = y;
      *(undefined4 *)&pDVar10->next = 8;
      *(uint *)((long)&pDVar10->next + 4) = table->keys - table->isolated;
      (pDVar10->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar10;
    }
    x_00 = cuddNextLow(table,x);
    if ((int)x_00 < xLow) {
      return 1;
    }
    y = x;
    if (iVar13 < local_58) {
      return 1;
    }
  } while( true );
}

Assistant:

static int
ddGroupSiftingUp(
  DdManager * table,
  int  y,
  int  xLow,
  DD_CHKFP checkFunction,
  Move ** moves)
{
    Move *move;
    int  x;
    int  size;
    int  i;
    int  gxtop,gybot;
    int  limitSize;
    int  xindex, yindex;
    int  zindex;
    int  z;
    int  isolated;
    int  L;     /* lower bound on DD size */
#ifdef DD_DEBUG
    int  checkL;
#endif

    yindex = table->invperm[y];

    /* Initialize the lower bound.
    ** The part of the DD below the bottom of y's group will not change.
    ** The part of the DD above y that does not interact with any
    ** variable of y's group will not change.
    ** The rest may vanish in the best case, except for
    ** the nodes at level xLow, which will not vanish, regardless.
    ** What we use here is not really a lower bound, because we ignore
    ** the interactions with all variables except y.
    */
    limitSize = L = table->keys - table->isolated;
    gybot = y;
    while ((unsigned) gybot < table->subtables[gybot].next)
        gybot = table->subtables[gybot].next;
    for (z = xLow + 1; z <= gybot; z++) {
        zindex = table->invperm[z];
        if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
            isolated = table->vars[zindex]->ref == 1;
            L -= table->subtables[z].keys - isolated;
        }
    }

    x = cuddNextLow(table,y);
    while (x >= xLow && L <= limitSize) {
#ifdef DD_DEBUG
        gybot = y;
        while ((unsigned) gybot < table->subtables[gybot].next)
            gybot = table->subtables[gybot].next;
        checkL = table->keys - table->isolated;
        for (z = xLow + 1; z <= gybot; z++) {
            zindex = table->invperm[z];
            if (zindex == yindex || cuddTestInteract(table,zindex,yindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkL -= table->subtables[z].keys - isolated;
            }
        }
        if (pr > 0 && L != checkL) {
            (void) fprintf(table->out,
                           "Inaccurate lower bound: L = %d checkL = %d\n",
                           L, checkL);
        }
#endif
        gxtop = table->subtables[x].next;
        if (checkFunction(table,x,y)) {
            /* Group found, attach groups */
            table->subtables[x].next = y;
            i = table->subtables[y].next;
            while (table->subtables[i].next != (unsigned) y)
                i = table->subtables[i].next;
            table->subtables[i].next = gxtop;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_NEWNODE;
            move->size = table->keys - table->isolated;
            move->next = *moves;
            *moves = move;
        } else if (table->subtables[x].next == (unsigned) x &&
                   table->subtables[y].next == (unsigned) y) {
            /* x and y are self groups */
            xindex = table->invperm[x];
            size = cuddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtables[x].next == (unsigned) x);
            assert(table->subtables[y].next == (unsigned) y);
#endif
            if (size == 0) goto ddGroupSiftingUpOutOfMem;
            /* Update the lower bound. */
            if (cuddTestInteract(table,xindex,yindex)) {
                isolated = table->vars[xindex]->ref == 1;
                L += table->subtables[y].keys - isolated;
            }
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto ddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,
                                       "ddGroupSiftingUp (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        } else { /* Group move */
            size = ddGroupMove(table,x,y,moves);
            if (size == 0) goto ddGroupSiftingUpOutOfMem;
            /* Update the lower bound. */
            z = (*moves)->y;
            do {
                zindex = table->invperm[z];
                if (cuddTestInteract(table,zindex,yindex)) {
                    isolated = table->vars[zindex]->ref == 1;
                    L += table->subtables[z].keys - isolated;
                }
                z = table->subtables[z].next;
            } while (z != (int) (*moves)->y);
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddNextLow(table,y);
    }

    return(1);

ddGroupSiftingUpOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}